

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_object.h
# Opt level: O0

void __thiscall CameraBase::saveFrame(CameraBase *this,Mat *frame_left,Mat *frame_right)

{
  FileStorage *pFVar1;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [32];
  FileStorage local_5c0 [8];
  FileStorage fsr;
  string local_580 [39];
  allocator local_559;
  string local_558 [32];
  FileStorage local_538 [8];
  FileStorage fsl;
  vector<int,_std::allocator<int>_> local_4f8;
  _InputArray local_4d8;
  allocator local_4b9;
  string local_4b8 [32];
  vector<int,_std::allocator<int>_> local_498;
  _InputArray local_478;
  allocator local_449;
  string local_448 [32];
  char local_428 [8];
  char fileName [1024];
  Mat *frame_right_local;
  Mat *frame_left_local;
  CameraBase *this_local;
  
  if ((this->m_saveFrames & 1U) != 0) {
    snprintf(local_428,0x400,"images/left_%d.png",(ulong)(uint)this->m_frameCount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,local_428,&local_449);
    cv::_InputArray::_InputArray(&local_478,frame_left);
    local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_498.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_498);
    cv::imwrite(local_448,&local_478,(vector *)&local_498);
    std::vector<int,_std::allocator<int>_>::~vector(&local_498);
    cv::_InputArray::~_InputArray(&local_478);
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    snprintf(local_428,0x400,"images/right_%d.png",(ulong)(uint)this->m_frameCount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b8,local_428,&local_4b9);
    cv::_InputArray::_InputArray(&local_4d8,frame_right);
    local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_4f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_4f8);
    cv::imwrite(local_4b8,&local_4d8,(vector *)&local_4f8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_4f8);
    cv::_InputArray::~_InputArray(&local_4d8);
    std::__cxx11::string::~string(local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    snprintf(local_428,0x400,"images/left_%d.yml",(ulong)(uint)this->m_frameCount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_558,local_428,&local_559);
    std::__cxx11::string::string(local_580);
    cv::FileStorage::FileStorage(local_538,local_558,1,local_580);
    std::__cxx11::string::~string(local_580);
    std::__cxx11::string::~string(local_558);
    std::allocator<char>::~allocator((allocator<char> *)&local_559);
    pFVar1 = cv::operator<<(local_538,"image");
    cv::operator<<(pFVar1,frame_left);
    snprintf(local_428,0x400,"images/right_%d.yml",(ulong)(uint)this->m_frameCount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e0,local_428,&local_5e1);
    std::__cxx11::string::string(local_608);
    cv::FileStorage::FileStorage(local_5c0,local_5e0,1,local_608);
    std::__cxx11::string::~string(local_608);
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    pFVar1 = cv::operator<<(local_5c0,"image");
    cv::operator<<(pFVar1,frame_right);
    cv::FileStorage::~FileStorage(local_5c0);
    cv::FileStorage::~FileStorage(local_538);
  }
  return;
}

Assistant:

void    saveFrame (cv::Mat &frame_left, cv::Mat &frame_right) {
                if (false == m_saveFrames) return;
                char fileName[1024];
                snprintf (fileName, sizeof (fileName), "images/left_%d.png", m_frameCount);
                imwrite (fileName, frame_left);
                snprintf (fileName, sizeof (fileName), "images/right_%d.png", m_frameCount);
                imwrite (fileName, frame_right);
                {
                    snprintf (fileName, sizeof (fileName), "images/left_%d.yml", m_frameCount);
                    cv::FileStorage fsl (fileName, cv::FileStorage::WRITE);
                    fsl << "image" << frame_left;
                    snprintf (fileName, sizeof (fileName), "images/right_%d.yml", m_frameCount);
                    cv::FileStorage fsr (fileName, cv::FileStorage::WRITE);
                    fsr << "image" << frame_right;
                }
              }